

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O1

void Min_SopDist1Merge(Min_Man_t *p)

{
  uint *__s;
  Min_Cube_t **ppMVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Min_Cube_t *pMVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  Min_Cube_t *pCube;
  Min_Cube_t *pCube_00;
  
  lVar7 = (long)p->nVars;
  if (-1 < lVar7) {
    do {
      for (pCube_00 = p->ppStore[lVar7]; pCube_00 != (Min_Cube_t *)0x0; pCube_00 = pCube_00->pNext)
      {
        for (pCube = pCube_00->pNext; pCube != (Min_Cube_t *)0x0; pCube = pCube->pNext) {
          if (0x3fffff < (*(uint *)&pCube->field_0x8 ^ *(uint *)&pCube_00->field_0x8)) {
            __assert_fail("pCube->nLits == pCube2->nLits",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1f7,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          uVar3 = *(uint *)&pCube_00->field_0x8 >> 10 & 0xfff;
          if (uVar3 == 0) {
LAB_003d3097:
            putchar(10);
            Min_CubeWrite(_stdout,pCube_00);
            Min_CubeWrite(_stdout,pCube);
            puts("Error: Min_CubesDistOne() looks at two equal cubes!");
          }
          else {
            uVar8 = 0;
            bVar2 = false;
            do {
              if ((pCube_00->uData[uVar8] != pCube->uData[uVar8]) &&
                 ((bVar2 || (uVar9 = pCube->uData[uVar8] ^ pCube_00->uData[uVar8],
                            uVar9 = (uVar9 >> 1 | uVar9) & 0x55555555, bVar2 = true,
                            (uVar9 & uVar9 - 1) != 0)))) goto LAB_003d31ce;
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
            if (!bVar2) goto LAB_003d3097;
          }
          if (((*(uint *)&pCube->field_0x8 ^ *(uint *)&pCube_00->field_0x8) & 0x3ff) != 0) {
            __assert_fail("pCube0->nVars == pCube1->nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                          ,0x1e3,"Min_Cube_t *Min_CubesXor(Min_Man_t *, Min_Cube_t *, Min_Cube_t *)"
                         );
          }
          pMVar5 = (Min_Cube_t *)Extra_MmFixedEntryFetch(p->pMemMan);
          pMVar5->pNext = (Min_Cube_t *)0x0;
          uVar3 = p->nVars & 0x3ff;
          *(uint *)&pMVar5->field_0x8 = *(uint *)&pMVar5->field_0x8 & 0xfffffc00 | uVar3;
          *(uint *)&pMVar5->field_0x8 = (p->nWords & 0xfffU) << 10 | uVar3;
          __s = pMVar5->uData;
          memset(__s,0xff,(long)p->nWords << 2);
          if (0 < p->nWords) {
            lVar6 = 0;
            do {
              __s[lVar6] = pCube->uData[lVar6] ^ pCube_00->uData[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 < p->nWords);
          }
          uVar3 = *(uint *)&pMVar5->field_0x8 >> 10 & 0xfff;
          if (uVar3 == 0) {
            uVar3 = 0;
          }
          else {
            uVar8 = 0;
            iVar4 = 0;
            do {
              uVar9 = 0xfffffffe;
              do {
                uVar9 = uVar9 + 2;
                iVar4 = iVar4 + (uint)(((__s[uVar8] >> 1 ^ __s[uVar8]) >> (uVar9 & 0x1f) & 1) != 0);
              } while (uVar9 < 0x1e);
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar3);
            uVar3 = iVar4 * 0x400000;
          }
          *(uint *)&pMVar5->field_0x8 = *(uint *)&pMVar5->field_0x8 & 0x3fffff | uVar3;
          uVar3 = uVar3 >> 0x16;
          if (uVar3 != (*(uint *)&pCube_00->field_0x8 >> 0x16) - 1) {
            __assert_fail("pCubeNew->nLits == pCube->nLits - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1fb,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          ppMVar1 = p->ppStore;
          pMVar5->pNext = ppMVar1[uVar3];
          ppMVar1[uVar3] = pMVar5;
          p->nCubes = p->nCubes + 1;
LAB_003d31ce:
        }
      }
      bVar2 = 0 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Min_SopDist1Merge( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pCube2, * pCubeNew;
    int i;
    for ( i = p->nVars; i >= 0; i-- )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        Min_CoverForEachCube( pCube->pNext, pCube2 )
        {
            assert( pCube->nLits == pCube2->nLits );
            if ( !Min_CubesDistOne( pCube, pCube2, NULL ) )
                continue;
            pCubeNew = Min_CubesXor( p, pCube, pCube2 );
            assert( pCubeNew->nLits == pCube->nLits - 1 );
            pCubeNew->pNext = p->ppStore[pCubeNew->nLits];
            p->ppStore[pCubeNew->nLits] = pCubeNew;
            p->nCubes++;
        }
    }
}